

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O3

Optional<llvm::DWARFFormValue> * __thiscall
llvm::AppleAcceleratorTable::Entry::lookup
          (Optional<llvm::DWARFFormValue> *__return_storage_ptr__,Entry *this,AtomType Atom)

{
  undefined8 *puVar1;
  uint uVar2;
  HeaderData *pHVar3;
  void *pvVar4;
  undefined8 uVar5;
  anon_union_8_3_82d75f4a_for_ValueType_0 aVar6;
  uint8_t *puVar7;
  uint64_t uVar8;
  DWARFContext *pDVar9;
  bool bVar10;
  AtomType *pAVar11;
  long lVar12;
  
  pHVar3 = this->HdrData;
  if (pHVar3 == (HeaderData *)0x0) {
    __assert_fail("HdrData && \"Dereferencing end iterator?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFAcceleratorTable.cpp"
                  ,0x116,
                  "Optional<DWARFFormValue> llvm::AppleAcceleratorTable::Entry::lookup(HeaderData::AtomType) const"
                 );
  }
  uVar2 = (pHVar3->Atoms).super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
          super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
          super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
          super_SmallVectorBase.Size;
  if (uVar2 != (this->super_Entry).Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
               super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
               super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
               Size) {
    __assert_fail("HdrData->Atoms.size() == Values.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFAcceleratorTable.cpp"
                  ,0x117,
                  "Optional<DWARFFormValue> llvm::AppleAcceleratorTable::Entry::lookup(HeaderData::AtomType) const"
                 );
  }
  if ((ulong)uVar2 != 0) {
    pAVar11 = (AtomType *)
              (pHVar3->Atoms).super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
              super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
              super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
              super_SmallVectorBase.BeginX;
    pvVar4 = (this->super_Entry).Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
             super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
             super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
             BeginX;
    lVar12 = 0;
    do {
      if (*pAVar11 == Atom) {
        uVar5 = *(undefined8 *)((long)pvVar4 + lVar12);
        aVar6 = *(anon_union_8_3_82d75f4a_for_ValueType_0 *)
                 ((undefined8 *)((long)pvVar4 + lVar12) + 1);
        puVar1 = (undefined8 *)((long)pvVar4 + lVar12 + 0x10);
        puVar7 = (uint8_t *)*puVar1;
        uVar8 = puVar1[1];
        puVar1 = (undefined8 *)((long)pvVar4 + lVar12 + 0x20);
        pDVar9 = (DWARFContext *)puVar1[1];
        (__return_storage_ptr__->Storage).field_0.value.U = (DWARFUnit *)*puVar1;
        (__return_storage_ptr__->Storage).field_0.value.C = pDVar9;
        (__return_storage_ptr__->Storage).field_0.value.Value.data = puVar7;
        (__return_storage_ptr__->Storage).field_0.value.Value.SectionIndex = uVar8;
        *(undefined8 *)&(__return_storage_ptr__->Storage).field_0 = uVar5;
        (__return_storage_ptr__->Storage).field_0.value.Value.field_0 = aVar6;
        bVar10 = true;
        goto LAB_00ad5227;
      }
      pAVar11 = pAVar11 + 2;
      lVar12 = lVar12 + 0x30;
    } while ((ulong)uVar2 * 0x30 != lVar12);
  }
  (__return_storage_ptr__->Storage).field_0.empty = '\0';
  bVar10 = false;
LAB_00ad5227:
  (__return_storage_ptr__->Storage).hasVal = bVar10;
  return __return_storage_ptr__;
}

Assistant:

Optional<DWARFFormValue>
AppleAcceleratorTable::Entry::lookup(HeaderData::AtomType Atom) const {
  assert(HdrData && "Dereferencing end iterator?");
  assert(HdrData->Atoms.size() == Values.size());
  for (const auto &Tuple : zip_first(HdrData->Atoms, Values)) {
    if (std::get<0>(Tuple).first == Atom)
      return std::get<1>(Tuple);
  }
  return None;
}